

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O2

bool __thiscall
helics::ForwardingTimeCoordinator::updateTimeFactors(ForwardingTimeCoordinator *this)

{
  TimeDependencies *dependencies;
  GlobalFederateId ignore;
  bool bVar1;
  long lVar2;
  bool bVar3;
  TimeData *pTVar4;
  TimeData *pTVar5;
  byte bVar6;
  ActionMessage upd;
  TimeData mTimeDownstream;
  TimeData mTimeUpstream;
  DependencyInfo dependency;
  TimeData td;
  ActionMessage upd_delayed;
  
  bVar6 = 0;
  dependencies = &(this->super_BaseTimeCoordinator).dependencies;
  generateMinTimeUpstream
            (&mTimeUpstream,dependencies,(this->super_BaseTimeCoordinator).restrictive_time_policy,
             (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
             (GlobalFederateId)0x8831d580,(this->super_BaseTimeCoordinator).sequenceCounter);
  if ((this->super_BaseTimeCoordinator).noParent == true) {
    pTVar4 = &mTimeUpstream;
    pTVar5 = &mTimeDownstream;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pTVar5->next).internalTimeCode = (pTVar4->next).internalTimeCode;
      pTVar4 = (TimeData *)((long)pTVar4 + (ulong)bVar6 * -0x10 + 8);
      pTVar5 = (TimeData *)((long)pTVar5 + (ulong)bVar6 * -0x10 + 8);
    }
  }
  else {
    generateMinTimeDownstream
              (&mTimeDownstream,dependencies,
               (this->super_BaseTimeCoordinator).restrictive_time_policy,
               (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
               (GlobalFederateId)0x8831d580,(this->super_BaseTimeCoordinator).sequenceCounter);
  }
  if ((mTimeUpstream.mTimeState < 4) && ((this->super_BaseTimeCoordinator).executionMode != false))
  {
    bVar3 = false;
  }
  else {
    bVar3 = TimeData::update(&(this->upstream).super_TimeData,&mTimeUpstream);
  }
  if ((mTimeDownstream.mTimeState < 4) && ((this->super_BaseTimeCoordinator).executionMode != false)
     ) {
    bVar1 = false;
  }
  else {
    bVar1 = TimeData::update(&(this->downstream).super_TimeData,&mTimeDownstream);
  }
  if ((this->upstream).super_TimeData.mTimeState == time_requested) {
    lVar2 = (this->upstream).super_TimeData.minDe.internalTimeCode;
    if (lVar2 < (this->downstream).super_TimeData.minDe.internalTimeCode) {
      (this->downstream).super_TimeData.minDe.internalTimeCode = lVar2;
    }
    lVar2 = (this->upstream).super_TimeData.Te.internalTimeCode;
    if (lVar2 < (this->downstream).super_TimeData.Te.internalTimeCode) {
      (this->downstream).super_TimeData.Te.internalTimeCode = lVar2;
    }
  }
  (this->super_BaseTimeCoordinator).sequenceCounter =
       this->sequenceModifier + (this->upstream).super_TimeData.sequenceCounter;
  bVar3 = (bool)(bVar3 | bVar1);
  if (bVar3 == true) {
    BaseTimeCoordinator::generateTimeRequest
              (&upd,&this->super_BaseTimeCoordinator,&(this->upstream).super_TimeData,
               (GlobalFederateId)0x8831d580,(this->upstream).super_TimeData.responseSequenceCounter)
    ;
    if (upd.messageAction != cmd_ignore) {
      transmitTimingMessagesUpstream(this,&upd);
    }
    ActionMessage::~ActionMessage(&upd);
  }
  ignore.gid = (this->super_BaseTimeCoordinator).dependencies.mDelayedDependency.gid;
  if (bVar1 == false) {
    if (ignore.gid == -2010000000) {
      return bVar3;
    }
    if (ignore.gid == -1700000000) {
      return bVar3;
    }
    if (mTimeDownstream.minFed.gid != ignore.gid) {
      return bVar3;
    }
    if ((this->super_BaseTimeCoordinator).executionMode != true) {
      return bVar3;
    }
    generateMinTimeUpstream
              (&dependency.super_TimeData,dependencies,
               (this->super_BaseTimeCoordinator).restrictive_time_policy,
               (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,ignore,0);
    DependencyInfo::DependencyInfo((DependencyInfo *)&upd_delayed);
    TimeData::update((TimeData *)&upd_delayed,&dependency.super_TimeData);
    BaseTimeCoordinator::generateTimeRequest
              (&upd,&this->super_BaseTimeCoordinator,(TimeData *)&upd_delayed,mTimeDownstream.minFed
               ,upd_delayed.payload.buffer._M_elems._0_4_);
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&(this->super_BaseTimeCoordinator).sendMessageFunction,&upd);
    }
  }
  else if (((ignore.gid == -2010000000) || (ignore.gid == -1700000000)) ||
          ((this->downstream).super_TimeData.minFed.gid != ignore.gid)) {
    BaseTimeCoordinator::generateTimeRequest
              (&upd,&this->super_BaseTimeCoordinator,&(this->downstream).super_TimeData,
               (GlobalFederateId)0x8831d580,0);
    if (upd.messageAction != cmd_ignore) {
      transmitTimingMessagesDownstream(this,&upd,(GlobalFederateId)0x8831d580);
    }
  }
  else {
    BaseTimeCoordinator::generateTimeRequest
              (&upd,&this->super_BaseTimeCoordinator,&(this->downstream).super_TimeData,
               (GlobalFederateId)0x8831d580,0);
    if (upd.messageAction != cmd_ignore) {
      transmitTimingMessagesDownstream
                (this,&upd,(GlobalFederateId)(this->downstream).super_TimeData.minFed.gid);
    }
    generateMinTimeUpstream
              (&td,dependencies,(this->super_BaseTimeCoordinator).restrictive_time_policy,
               (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
               (GlobalFederateId)(this->downstream).super_TimeData.minFed.gid,0);
    DependencyInfo::DependencyInfo(&dependency);
    TimeData::update(&dependency.super_TimeData,&td);
    BaseTimeCoordinator::generateTimeRequest
              (&upd_delayed,&this->super_BaseTimeCoordinator,&dependency.super_TimeData,
               (GlobalFederateId)(this->downstream).super_TimeData.minFed.gid,
               dependency.super_TimeData.responseSequenceCounter);
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&(this->super_BaseTimeCoordinator).sendMessageFunction,&upd_delayed);
    }
    ActionMessage::~ActionMessage(&upd_delayed);
  }
  ActionMessage::~ActionMessage(&upd);
  return bVar3;
}

Assistant:

bool ForwardingTimeCoordinator::updateTimeFactors()
{
    auto mTimeUpstream = generateMinTimeUpstream(
        dependencies, restrictive_time_policy, mSourceId, NoIgnoredFederates, sequenceCounter);
    auto mTimeDownstream = (noParent) ? mTimeUpstream :
                                        generateMinTimeDownstream(dependencies,
                                                                  restrictive_time_policy,
                                                                  mSourceId,
                                                                  NoIgnoredFederates,
                                                                  sequenceCounter);

    bool updateUpStream{false};
    bool updateDownStream{false};
    if (mTimeUpstream.mTimeState > TimeState::exec_requested || !executionMode) {
        updateUpStream = upstream.update(mTimeUpstream);
    }
    if (mTimeDownstream.mTimeState > TimeState::exec_requested || !executionMode) {
        updateDownStream = downstream.update(mTimeDownstream);
    }

    if (upstream.mTimeState == TimeState::time_requested) {
        if (upstream.minDe < downstream.minDe) {
            downstream.minDe = upstream.minDe;
        }
        if (upstream.Te < downstream.Te) {
            downstream.Te = upstream.Te;
        }
    }
    if (!restrictive_time_policy && upstream.minDe < Time::maxVal()) {
        if (downstream.minDe > downstream.next) {
            //     downstream.next = downstream.minminDe;
        }
    }

    sequenceCounter = upstream.sequenceCounter + sequenceModifier;
    if (updateUpStream || updateDownStream) {
        auto upd =
            generateTimeRequest(upstream, GlobalFederateId{}, upstream.responseSequenceCounter);
        if (upd.action() != CMD_IGNORE) {
            transmitTimingMessagesUpstream(upd);
        }
    }
    if (updateDownStream) {
        if (dependencies.hasDelayedDependency() &&
            downstream.minFed == dependencies.delayedDependency()) {
            auto upd = generateTimeRequest(downstream, GlobalFederateId{}, 0);
            if (upd.action() != CMD_IGNORE) {
                transmitTimingMessagesDownstream(upd, downstream.minFed);
            }
            auto td = generateMinTimeUpstream(
                dependencies, restrictive_time_policy, mSourceId, downstream.minFed, 0);
            DependencyInfo dependency;
            dependency.update(td);
            auto upd_delayed = generateTimeRequest(dependency,
                                                   downstream.minFed,
                                                   dependency.responseSequenceCounter);
            if (sendMessageFunction) {
                sendMessageFunction(upd_delayed);
            }
        } else {
            auto upd = generateTimeRequest(downstream, GlobalFederateId{}, 0);
            if (upd.action() != CMD_IGNORE) {
                transmitTimingMessagesDownstream(upd);
            }
        }
    } else if (dependencies.hasDelayedDependency() &&
               mTimeDownstream.minFed == dependencies.delayedDependency() && executionMode) {
        auto minTimeUpstream = generateMinTimeUpstream(
            dependencies, restrictive_time_policy, mSourceId, mTimeDownstream.minFed, 0);
        DependencyInfo dependency;
        dependency.update(minTimeUpstream);
        auto upd_delayed = generateTimeRequest(dependency,
                                               mTimeDownstream.minFed,
                                               dependency.responseSequenceCounter);
        if (sendMessageFunction) {
            sendMessageFunction(upd_delayed);
        }
    }
    return (updateUpStream || updateDownStream);
}